

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O0

void __thiscall
Js::TypedArray<unsigned_int,_false,_true>::MarshalCrossSite_TTDInflate
          (TypedArray<unsigned_int,_false,_true> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  TypedArray<unsigned_int,_false,_true> *this_local;
  
  bVar2 = VirtualTableInfo<Js::TypedArray<unsigned_int,_false,_true>_>::HasVirtualTable(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/TypedArray.h"
                                ,0x105,"(VirtualTableInfo<TypedArray>::HasVirtualTable(this))",
                                "Derived class need to define marshal");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  VirtualTableInfo<Js::CrossSiteObject<Js::TypedArray<unsigned_int,_false,_true>_>_>::
  SetVirtualTable(this);
  return;
}

Assistant:

TypedArray(DynamicType *type): TypedArrayBase(nullptr, 0, 0, sizeof(TypeName), type) { buffer = nullptr; }